

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall S2Loop::InitIndex(S2Loop *this)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_S2Shape_*,_false> local_28;
  S2LogMessage local_20;
  
  local_28._M_head_impl = (S2Shape *)operator_new(0x18);
  (local_28._M_head_impl)->id_ = -1;
  (local_28._M_head_impl)->_vptr_S2Shape = (_func_int **)&PTR__S2Shape_002c24a0;
  local_28._M_head_impl[1]._vptr_S2Shape = (_func_int **)this;
  MutableS2ShapeIndex::Add
            (&this->index_,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_28);
  if (local_28._M_head_impl != (S2Shape *)0x0) {
    (*(local_28._M_head_impl)->_vptr_S2Shape[1])();
  }
  local_28._M_head_impl = (S2Shape *)0x0;
  if (FLAGS_s2loop_lazy_indexing == false) {
    MutableS2ShapeIndex::ForceBuild(&this->index_);
  }
  if ((FLAGS_s2debug == true) && (this->s2debug_override_ == ALLOW)) {
    bVar1 = IsValid(this);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
                 ,0x11c,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: IsValid() ",0x18);
      if (!bVar1) {
        abort();
      }
    }
  }
  return;
}

Assistant:

void S2Loop::InitIndex() {
  index_.Add(make_unique<Shape>(this));
  if (!FLAGS_s2loop_lazy_indexing) {
    index_.ForceBuild();
  }
  if (FLAGS_s2debug && s2debug_override_ == S2Debug::ALLOW) {
    // Note that FLAGS_s2debug is false in optimized builds (by default).
    S2_CHECK(IsValid());
  }
}